

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O0

void __thiscall ImGuiTextBuffer::clear(ImGuiTextBuffer *this)

{
  value_type local_11;
  ImGuiTextBuffer *local_10;
  ImGuiTextBuffer *this_local;
  
  local_10 = this;
  ImVector<char>::clear(&this->Buf);
  local_11 = '\0';
  ImVector<char>::push_back(&this->Buf,&local_11);
  return;
}

Assistant:

void                clear() { Buf.clear(); Buf.push_back(0); }